

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdesinfo.cpp
# Opt level: O0

bool __thiscall
jrtplib::RTCPSDESInfo::GetNextPrivateValue
          (RTCPSDESInfo *this,uint8_t **prefix,size_t *prefixlen,uint8_t **value,size_t *valuelen)

{
  bool bVar1;
  reference ppSVar2;
  uint8_t *puVar3;
  iterator local_48;
  _List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*> local_40;
  size_t *local_38;
  size_t *valuelen_local;
  uint8_t **value_local;
  size_t *prefixlen_local;
  uint8_t **prefix_local;
  RTCPSDESInfo *this_local;
  
  local_38 = valuelen;
  valuelen_local = (size_t *)value;
  value_local = (uint8_t **)prefixlen;
  prefixlen_local = (size_t *)prefix;
  prefix_local = (uint8_t **)this;
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
       ::end(&this->privitems);
  std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::_List_const_iterator
            (&local_40,&local_48);
  bVar1 = std::operator==(&this->curitem,&local_40);
  if (!bVar1) {
    ppSVar2 = std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::operator*
                        (&this->curitem);
    puVar3 = SDESPrivateItem::GetPrefix(*ppSVar2,(size_t *)value_local);
    *prefixlen_local = (size_t)puVar3;
    ppSVar2 = std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::operator*
                        (&this->curitem);
    puVar3 = SDESItem::GetInfo(&(*ppSVar2)->super_SDESItem,local_38);
    *valuelen_local = (size_t)puVar3;
    std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::operator++(&this->curitem);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool RTCPSDESInfo::GetNextPrivateValue(uint8_t **prefix,size_t *prefixlen,uint8_t **value,size_t *valuelen)
{
	if (curitem == privitems.end())
		return false;
	*prefix = (*curitem)->GetPrefix(prefixlen);
	*value = (*curitem)->GetInfo(valuelen);
	++curitem;
	return true;
}